

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O2

void __thiscall EOClient::Send(EOClient *this,PacketBuilder *builder)

{
  size_type sVar1;
  size_t i;
  ulong uVar2;
  string local_80;
  string data;
  string local_40;
  
  PacketBuilder::operator_cast_to_string(&local_80,builder);
  PacketProcessor::Encode(&data,&this->processor,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  if (this->upload_fh == (FILE *)0x0) {
    PacketBuilder::operator_cast_to_string(&local_40,builder);
    PacketProcessor::Encode(&local_80,&this->processor,&local_40);
    Client::Send(&this->super_Client,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    sVar1 = (this->send_buffer2)._M_string_length;
    if (sVar1 - this->send_buffer2_used < data._M_string_length) {
      Client::Close(&this->super_Client,true);
    }
    else {
      for (uVar2 = 0; uVar2 < data._M_string_length; uVar2 = uVar2 + 1) {
        (this->send_buffer2)._M_dataplus._M_p[this->send_buffer2_ppos] =
             data._M_dataplus._M_p[uVar2];
        this->send_buffer2_ppos = this->send_buffer2_ppos + 1 & sVar1 - 1;
      }
      this->send_buffer2_used = this->send_buffer2_used + data._M_string_length;
    }
  }
  std::__cxx11::string::~string((string *)&data);
  return;
}

Assistant:

void EOClient::Send(const PacketBuilder &builder)
{
	std::string data= this->processor.Encode(builder);

	if (this->upload_fh)
	{
		// Stick any incoming data in to our temporary buffer
		if (data.length() > this->send_buffer2.length() - this->send_buffer2_used)
		{
			this->Close(true);
			return;
		}

		const std::size_t mask = this->send_buffer2.length() - 1;

		for (std::size_t i = 0; i < data.length(); ++i)
		{
			this->send_buffer2[this->send_buffer2_ppos] = data[i];
			this->send_buffer2_ppos = (this->send_buffer2_ppos + 1) & mask;
		}

		this->send_buffer2_used += data.length();
	}
	else
	{
		Client::Send(this->processor.Encode(builder));
	}
}